

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_restore(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  char *astr;
  CHAR_DATA *pCVar3;
  char *arg1;
  char *format;
  DESCRIPTOR_DATA **ppDVar4;
  CHAR_DATA **ppCVar5;
  char *txt;
  char arg [4608];
  char buf [4608];
  
  astr = one_argument(argument,arg);
  if (arg[0] == '\0') {
LAB_002cbc70:
    ppCVar5 = &ch->in_room->people;
    while (pCVar3 = *ppCVar5, pCVar3 != (CHAR_DATA *)0x0) {
      switchD_00333f01::default(pCVar3,(int)gsn_plague);
      switchD_00333f01::default(pCVar3,(int)gsn_poison);
      switchD_00333f01::default(pCVar3,(int)gsn_blindness);
      switchD_00333f01::default(pCVar3,(int)gsn_sleep);
      switchD_00333f01::default(pCVar3,(int)gsn_curse);
      pCVar3->hit = (int)pCVar3->max_hit;
      pCVar3->mana = pCVar3->max_mana;
      pCVar3->move = pCVar3->max_move;
      bVar1 = is_npc(pCVar3);
      if (!bVar1) {
        update_pos(pCVar3);
      }
      act("$n has restored you.",ch,(void *)0x0,pCVar3,2);
      ppCVar5 = &pCVar3->next_in_room;
    }
    sprintf(buf,"$N restored room %d.",(ulong)(uint)(int)ch->in_room->vnum);
    txt = "Room restored.\n\r";
  }
  else {
    bVar1 = str_cmp(arg,"room");
    if (!bVar1) goto LAB_002cbc70;
    iVar2 = get_trust(ch);
    if (0x39 < iVar2) {
      bVar1 = str_cmp(arg,"all");
      if (!bVar1) {
        ppDVar4 = &descriptor_list;
        txt = "All active players restored.\n\r";
        while (ppDVar4 = &((DESCRIPTOR_DATA *)ppDVar4)->next->next,
              (DESCRIPTOR_DATA *)ppDVar4 != (DESCRIPTOR_DATA *)0x0) {
          pCVar3 = ((DESCRIPTOR_DATA *)ppDVar4)->character;
          if (pCVar3 != (CHAR_DATA *)0x0) {
            bVar1 = is_npc(pCVar3);
            if (!bVar1) {
              switchD_00333f01::default(pCVar3,(int)gsn_plague);
              switchD_00333f01::default(pCVar3,(int)gsn_poison);
              switchD_00333f01::default(pCVar3,(int)gsn_blindness);
              switchD_00333f01::default(pCVar3,(int)gsn_sleep);
              switchD_00333f01::default(pCVar3,(int)gsn_curse);
              pCVar3->hit = (int)pCVar3->max_hit;
              pCVar3->mana = pCVar3->max_mana;
              pCVar3->move = pCVar3->max_move;
              bVar1 = is_npc(pCVar3);
              if (!bVar1) {
                update_pos(pCVar3);
              }
              if (pCVar3->in_room != (ROOM_INDEX_DATA *)0x0) {
                if (astr == (char *)0x0) {
LAB_002cbec8:
                  format = "$n has restored you.";
                  arg1 = (char *)0x0;
                }
                else {
                  bVar1 = str_cmp(astr,"");
                  if (!bVar1) goto LAB_002cbec8;
                  format = "$t has restored you.";
                  arg1 = astr;
                }
                act(format,ch,arg1,pCVar3,2);
              }
            }
          }
        }
        goto LAB_002cbda3;
      }
    }
    pCVar3 = get_char_world(ch,arg);
    if (pCVar3 == (CHAR_DATA *)0x0) {
      txt = "They aren\'t here.\n\r";
      goto LAB_002cbda3;
    }
    switchD_00333f01::default(pCVar3,(int)gsn_plague);
    switchD_00333f01::default(pCVar3,(int)gsn_poison);
    switchD_00333f01::default(pCVar3,(int)gsn_blindness);
    switchD_00333f01::default(pCVar3,(int)gsn_sleep);
    switchD_00333f01::default(pCVar3,(int)gsn_curse);
    pCVar3->hit = (int)pCVar3->max_hit;
    pCVar3->mana = pCVar3->max_mana;
    pCVar3->move = pCVar3->max_move;
    bVar1 = is_npc(pCVar3);
    if (!bVar1) {
      update_pos(pCVar3);
    }
    act("$n has restored you.",ch,(void *)0x0,pCVar3,2);
    bVar1 = is_npc(pCVar3);
    sprintf(buf,"$N restored %s",(&pCVar3->name)[(ulong)bVar1 * 4]);
    txt = "Ok.\n\r";
  }
  iVar2 = get_trust(ch);
  wiznet(buf,ch,(OBJ_DATA *)0x0,0xf,0xc,iVar2);
LAB_002cbda3:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_restore(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;
	CHAR_DATA *vch;
	DESCRIPTOR_DATA *d;

	argument = one_argument(argument, arg);

	if (arg[0] == '\0' || !str_cmp(arg, "room"))
	{
		/* cure room */

		for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
		{
			affect_strip(vch, gsn_plague);
			affect_strip(vch, gsn_poison);
			affect_strip(vch, gsn_blindness);
			affect_strip(vch, gsn_sleep);
			affect_strip(vch, gsn_curse);

			vch->hit = vch->max_hit;
			vch->mana = vch->max_mana;
			vch->move = vch->max_move;

			if (!is_npc(vch))
				update_pos(vch);

			act("$n has restored you.", ch, nullptr, vch, TO_VICT);
		}

		sprintf(buf, "$N restored room %d.", ch->in_room->vnum);
		wiznet(buf, ch, nullptr, WIZ_RESTORE, WIZ_SECURE, get_trust(ch));

		send_to_char("Room restored.\n\r", ch);
		return;
	}

	if (get_trust(ch) >= MAX_LEVEL - 2 && !str_cmp(arg, "all"))
	{
		/* cure all */

		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			victim = d->character;

			if (victim == nullptr || is_npc(victim))
				continue;

			affect_strip(victim, gsn_plague);
			affect_strip(victim, gsn_poison);
			affect_strip(victim, gsn_blindness);
			affect_strip(victim, gsn_sleep);
			affect_strip(victim, gsn_curse);

			victim->hit = victim->max_hit;
			victim->mana = victim->max_mana;
			victim->move = victim->max_move;

			if (!is_npc(victim))
				update_pos(victim);

			if (victim->in_room != nullptr)
			{
				if (!argument || !str_cmp(argument, ""))
					act("$n has restored you.", ch, nullptr, victim, TO_VICT);
				else
					act("$t has restored you.", ch, argument, victim, TO_VICT);
			}
		}

		send_to_char("All active players restored.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	affect_strip(victim, gsn_plague);
	affect_strip(victim, gsn_poison);
	affect_strip(victim, gsn_blindness);
	affect_strip(victim, gsn_sleep);
	affect_strip(victim, gsn_curse);

	victim->hit = victim->max_hit;
	victim->mana = victim->max_mana;
	victim->move = victim->max_move;

	if (!is_npc(victim))
		update_pos(victim);

	act("$n has restored you.", ch, nullptr, victim, TO_VICT);

	sprintf(buf, "$N restored %s", is_npc(victim) ? victim->short_descr : victim->name);
	wiznet(buf, ch, nullptr, WIZ_RESTORE, WIZ_SECURE, get_trust(ch));

	send_to_char("Ok.\n\r", ch);
}